

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_common.h
# Opt level: O0

void get_txb_ctx_general(BLOCK_SIZE plane_bsize,TX_SIZE tx_size,int plane,ENTROPY_CONTEXT *a,
                        ENTROPY_CONTEXT *l,TXB_CTX *txb_ctx)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  byte in_SIL;
  BLOCK_SIZE in_DIL;
  long in_R8;
  uint *in_R9;
  int ctx_offset;
  int ctx_base;
  int left;
  int top;
  uint sign_1;
  uint sign;
  int k;
  int dc_sign;
  int txb_h_unit;
  int txb_w_unit;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint local_40;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar3;
  int local_30;
  int local_2c;
  
  iVar1 = tx_size_wide_unit[in_SIL];
  iVar2 = tx_size_high_unit[in_SIL];
  local_2c = 0;
  local_30 = 0;
  do {
    local_2c = ""[(uint)((int)(uint)*(byte *)(in_RCX + local_30) >> 3)] + local_2c;
    local_30 = local_30 + 1;
  } while (local_30 < iVar1);
  local_30 = 0;
  do {
    local_2c = ""[(uint)((int)(uint)*(byte *)(in_R8 + local_30) >> 3)] + local_2c;
    local_30 = local_30 + 1;
  } while (local_30 < iVar2);
  in_R9[1] = (int)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                  [local_2c + 0x20];
  if (in_EDX == 0) {
    if (in_DIL == txsize_to_bsize[in_SIL]) {
      *in_R9 = 0;
    }
    else {
      uVar3 = 0;
      local_40 = 0;
      local_30 = 0;
      do {
        uVar3 = (int)*(char *)(in_RCX + local_30) | uVar3;
        local_30 = local_30 + 1;
      } while (local_30 < iVar1);
      uVar3 = uVar3 & 7;
      if (3 < uVar3) {
        uVar3 = 4;
      }
      local_30 = 0;
      do {
        local_40 = (int)*(char *)(in_R8 + local_30) | local_40;
        local_30 = local_30 + 1;
      } while (local_30 < iVar2);
      local_40 = local_40 & 7;
      if (3 < local_40) {
        local_40 = 4;
      }
      *in_R9 = (uint)get_txb_ctx_general::skip_contexts[(int)uVar3][(int)local_40];
    }
  }
  else {
    iVar1 = get_entropy_context((TX_SIZE)((uint)in_stack_ffffffffffffffc4 >> 0x18),
                                (ENTROPY_CONTEXT *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                (ENTROPY_CONTEXT *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    iVar2 = 7;
    if ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[txsize_to_bsize[in_SIL]] <
        "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[in_DIL]) {
      iVar2 = 10;
    }
    *in_R9 = iVar1 + iVar2;
  }
  return;
}

Assistant:

static void get_txb_ctx_general(const BLOCK_SIZE plane_bsize,
                                const TX_SIZE tx_size, const int plane,
                                const ENTROPY_CONTEXT *const a,
                                const ENTROPY_CONTEXT *const l,
                                TXB_CTX *const txb_ctx) {
#define MAX_TX_SIZE_UNIT 16
  static const int8_t signs[3] = { 0, -1, 1 };
  static const int8_t dc_sign_contexts[4 * MAX_TX_SIZE_UNIT + 1] = {
    1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1,
    1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2,
    2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2, 2
  };
  const int txb_w_unit = tx_size_wide_unit[tx_size];
  const int txb_h_unit = tx_size_high_unit[tx_size];
  int dc_sign = 0;
  int k = 0;

  do {
    const unsigned int sign = ((uint8_t)a[k]) >> COEFF_CONTEXT_BITS;
    assert(sign <= 2);
    dc_sign += signs[sign];
  } while (++k < txb_w_unit);

  k = 0;
  do {
    const unsigned int sign = ((uint8_t)l[k]) >> COEFF_CONTEXT_BITS;
    assert(sign <= 2);
    dc_sign += signs[sign];
  } while (++k < txb_h_unit);

  txb_ctx->dc_sign_ctx = dc_sign_contexts[dc_sign + 2 * MAX_TX_SIZE_UNIT];

  if (plane == 0) {
    if (plane_bsize == txsize_to_bsize[tx_size]) {
      txb_ctx->txb_skip_ctx = 0;
    } else {
      // This is the algorithm to generate table skip_contexts[top][left].
      //    const int max = AOMMIN(top | left, 4);
      //    const int min = AOMMIN(AOMMIN(top, left), 4);
      //    if (!max)
      //      txb_skip_ctx = 1;
      //    else if (!min)
      //      txb_skip_ctx = 2 + (max > 3);
      //    else if (max <= 3)
      //      txb_skip_ctx = 4;
      //    else if (min <= 3)
      //      txb_skip_ctx = 5;
      //    else
      //      txb_skip_ctx = 6;
      static const uint8_t skip_contexts[5][5] = { { 1, 2, 2, 2, 3 },
                                                   { 2, 4, 4, 4, 5 },
                                                   { 2, 4, 4, 4, 5 },
                                                   { 2, 4, 4, 4, 5 },
                                                   { 3, 5, 5, 5, 6 } };
      // For top and left, we only care about which of the following three
      // categories they belong to: { 0 }, { 1, 2, 3 }, or { 4, 5, ... }. The
      // spec calculates top and left with the Max() function. We can calculate
      // an approximate max with bitwise OR because the real max and the
      // approximate max belong to the same category.
      int top = 0;
      int left = 0;

      k = 0;
      do {
        top |= a[k];
      } while (++k < txb_w_unit);
      top &= COEFF_CONTEXT_MASK;
      top = AOMMIN(top, 4);

      k = 0;
      do {
        left |= l[k];
      } while (++k < txb_h_unit);
      left &= COEFF_CONTEXT_MASK;
      left = AOMMIN(left, 4);

      txb_ctx->txb_skip_ctx = skip_contexts[top][left];
    }
  } else {
    const int ctx_base = get_entropy_context(tx_size, a, l);
    const int ctx_offset = (num_pels_log2_lookup[plane_bsize] >
                            num_pels_log2_lookup[txsize_to_bsize[tx_size]])
                               ? 10
                               : 7;
    txb_ctx->txb_skip_ctx = ctx_base + ctx_offset;
  }
}